

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int check_7zip_header_in_sfx(char *p)

{
  char cVar1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  void *in_RDI;
  int local_4;
  
  cVar1 = *(char *)((long)in_RDI + 5);
  if (cVar1 == '\x1c') {
    iVar2 = memcmp(in_RDI,anon_var_dwarf_35caa,6);
    if (iVar2 == 0) {
      uVar4 = crc32(0,(long)in_RDI + 0xc,0x14);
      uVar3 = archive_le32dec((void *)((long)in_RDI + 8));
      if (uVar4 == uVar3) {
        local_4 = 0;
      }
      else {
        local_4 = 6;
      }
    }
    else {
      local_4 = 6;
    }
  }
  else if (cVar1 == '\'') {
    local_4 = 1;
  }
  else if (cVar1 == '7') {
    local_4 = 5;
  }
  else if (cVar1 == 'z') {
    local_4 = 4;
  }
  else if (cVar1 == -0x51) {
    local_4 = 2;
  }
  else if (cVar1 == -0x44) {
    local_4 = 3;
  }
  else {
    local_4 = 6;
  }
  return local_4;
}

Assistant:

static int
check_7zip_header_in_sfx(const char *p)
{
	switch ((unsigned char)p[5]) {
	case 0x1C:
		if (memcmp(p, _7ZIP_SIGNATURE, 6) != 0)
			return (6);
		/*
		 * Test the CRC because its extraction code has 7-Zip
		 * Magic Code, so we should do this in order not to
		 * make a mis-detection.
		 */
		if (crc32(0, (const unsigned char *)p + 12, 20)
			!= archive_le32dec(p + 8))
			return (6);
		/* Hit the header! */
		return (0);
	case 0x37: return (5);
	case 0x7A: return (4);
	case 0xBC: return (3);
	case 0xAF: return (2);
	case 0x27: return (1);
	default: return (6);
	}
}